

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

char * Acb_DeriveOnePatchFunction
                 (Cnf_Dat_t *pCnf,int iTar,int nTargets,int nCoDivs,Vec_Int_t *vUsed,int fCisOnly)

{
  uint uVar1;
  char *__ptr;
  Vec_Str_t *__ptr_00;
  int iVar2;
  Vec_Int_t *vTempLits;
  int *piVar3;
  sat_solver *s;
  char *pcVar4;
  long lVar5;
  int iVar6;
  int Lit;
  lit local_3c;
  Vec_Str_t *local_38;
  
  uVar1 = vUsed->nSize;
  vTempLits = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < uVar1) {
    iVar6 = uVar1 + 1;
  }
  vTempLits->nSize = 0;
  vTempLits->nCap = iVar6;
  if (iVar6 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar6 << 2);
  }
  vTempLits->pArray = piVar3;
  local_38 = (Vec_Str_t *)calloc(1,0x10);
  iVar6 = pCnf->nVars - (uVar1 + nTargets);
  s = sat_solver_new();
  sat_solver_setnvars(s,pCnf->nVars + 1);
  lVar5 = 0;
  while (lVar5 < pCnf->nClauses) {
    iVar2 = sat_solver_addclause(s,pCnf->pClauses[lVar5],pCnf->pClauses[lVar5 + 1]);
    lVar5 = lVar5 + 1;
    if (iVar2 == 0) goto LAB_00397928;
  }
  local_3c = 2;
  iVar2 = sat_solver_addclause(s,&local_3c,(lit *)&local_38);
  __ptr_00 = local_38;
  if (iVar2 == 0) goto LAB_00397928;
  if (fCisOnly == 0) {
    if (0 < vUsed->nSize) {
      piVar3 = vUsed->pArray;
      lVar5 = 0;
      do {
        piVar3[lVar5] = piVar3[lVar5] + 2;
        lVar5 = lVar5 + 1;
      } while (lVar5 < vUsed->nSize);
    }
  }
  else if (0 < vUsed->nSize) {
    piVar3 = vUsed->pArray;
    lVar5 = 0;
    do {
      piVar3[lVar5] = piVar3[lVar5] + iVar6;
      lVar5 = lVar5 + 1;
    } while (lVar5 < vUsed->nSize);
  }
  pcVar4 = Acb_EnumerateSatAssigns
                     (s,(iTar - nTargets) + pCnf->nVars,pCnf->nVars,vUsed,vTempLits,local_38);
  if (vTempLits->pArray != (int *)0x0) {
    free(vTempLits->pArray);
  }
  free(vTempLits);
  __ptr = __ptr_00->pArray;
  if (__ptr != (char *)0x0) {
    free(__ptr);
  }
  free(__ptr_00);
  sat_solver_delete(s);
  if (pcVar4 == (char *)0x0) {
LAB_00397928:
    pcVar4 = (char *)0x0;
  }
  else if (fCisOnly == 0) {
    if (0 < vUsed->nSize) {
      piVar3 = vUsed->pArray;
      lVar5 = 0;
      do {
        piVar3[lVar5] = piVar3[lVar5] + -2;
        lVar5 = lVar5 + 1;
      } while (lVar5 < vUsed->nSize);
    }
  }
  else if (0 < vUsed->nSize) {
    piVar3 = vUsed->pArray;
    lVar5 = 0;
    do {
      piVar3[lVar5] = piVar3[lVar5] - iVar6;
      lVar5 = lVar5 + 1;
    } while (lVar5 < vUsed->nSize);
  }
  return pcVar4;
}

Assistant:

char * Acb_DeriveOnePatchFunction( Cnf_Dat_t * pCnf, int iTar, int nTargets, int nCoDivs, Vec_Int_t * vUsed, int fCisOnly )
{
    char * pSop = NULL;
    Vec_Int_t * vTempLits = Vec_IntAlloc( Vec_IntSize(vUsed)+1 );
    Vec_Str_t * vTempSop = Vec_StrAlloc(0);
    int i, Lit;
    int iCiVarBeg = pCnf->nVars - nTargets - Vec_IntSize(vUsed);
    int iCoVarBeg = 1, Index;
    sat_solver * pSat = sat_solver_new(); 
    sat_solver_setnvars( pSat, pCnf->nVars + 1 );
    // add clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            return NULL;
    // add output clause
    Lit = Abc_Var2Lit( iCoVarBeg, 0 );
    if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
        return NULL;
    // remap vUsed to be in terms of divisor variables
    if ( fCisOnly )
    {
        Vec_IntForEachEntry( vUsed, Index, i )
            Vec_IntWriteEntry( vUsed, i, iCiVarBeg + Index );
    }
    else
    {
        Vec_IntForEachEntry( vUsed, Index, i )
            Vec_IntWriteEntry( vUsed, i, iCoVarBeg + 1 + Index );
    }
    // enumerate assignments for each target in terms of used divisors
    pSop = Acb_EnumerateSatAssigns( pSat, pCnf->nVars - nTargets + iTar, pCnf->nVars, vUsed, vTempLits, vTempSop );
    Vec_IntFree( vTempLits );
    Vec_StrFree( vTempSop );
    sat_solver_delete( pSat );
    if ( pSop == NULL )
        return NULL;
    //printf( "Function %d:\n%s", i, pSop );
    // remap vUsed to be in terms of original divisors
    if ( fCisOnly )
    {
        Vec_IntForEachEntry( vUsed, Index, i )
            Vec_IntWriteEntry( vUsed, i, Index - iCiVarBeg );
    }
    else
    {
        Vec_IntForEachEntry( vUsed, Index, i )
            Vec_IntWriteEntry( vUsed, i, Index - (iCoVarBeg + 1) );
    }
    return pSop;
}